

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pulseaudio.cpp
# Opt level: O2

void anon_unknown.dwarf_26ba73::PulsePlayback::streamWriteCallbackC
               (pa_stream *stream,size_t nbytes,void *pdata)

{
  ulong uVar1;
  int iVar2;
  uint uVar3;
  undefined8 uVar4;
  size_t buflen;
  void *buf;
  ulong local_48;
  void *local_40;
  FILE *local_38;
  
  do {
    local_48 = 0xffffffffffffffff;
    iVar2 = (*(anonymous_namespace)::ppa_stream_begin_write)(stream,&local_40,&local_48);
    if ((iVar2 == 0) && (local_40 != (void *)0x0)) {
      if (nbytes <= local_48) {
        local_48 = nbytes;
      }
      uVar4 = 0;
    }
    else {
      local_48 = nbytes;
      local_40 = (void *)(*(anonymous_namespace)::ppa_xmalloc)(nbytes);
      uVar4 = (anonymous_namespace)::ppa_xfree;
    }
    uVar1 = local_48;
    ALCdevice::renderSamples
              (*(ALCdevice **)((long)pdata + 8),local_40,
               (ALuint)(local_48 / *(uint *)((long)pdata + 200)),
               (ulong)*(byte *)((long)pdata + 0xb4));
    uVar3 = (*(anonymous_namespace)::ppa_stream_write)(stream,local_40,local_48,uVar4,0,0);
    if ((uVar3 != 0) && (0 < (int)gLogLevel)) {
      local_38 = (FILE *)gLogFile;
      uVar4 = (*(anonymous_namespace)::ppa_strerror)(uVar3);
      fprintf(local_38,"[ALSOFT] (EE) Failed to write to stream: %d, %s\n",(ulong)uVar3,uVar4);
    }
    nbytes = nbytes - uVar1;
  } while (nbytes != 0);
  return;
}

Assistant:

static void streamWriteCallbackC(pa_stream *stream, size_t nbytes, void *pdata) noexcept
    { static_cast<PulsePlayback*>(pdata)->streamWriteCallback(stream, nbytes); }